

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::MergeFrom
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  int *piVar1;
  byte *pbVar2;
  int iVar3;
  void **ppvVar4;
  DescriptorProto *from_00;
  EnumDescriptorProto *from_01;
  ServiceDescriptorProto *from_02;
  FieldDescriptorProto *from_03;
  uint uVar5;
  LogMessage *other;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  ServiceDescriptorProto *this_02;
  FieldDescriptorProto *this_03;
  string *psVar6;
  FileOptions *this_04;
  SourceCodeInfo *this_05;
  int iVar7;
  FileOptions *from_04;
  SourceCodeInfo *from_05;
  long lVar8;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x605);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->dependency_).super_RepeatedPtrFieldBase,
             (from->dependency_).super_RepeatedPtrFieldBase.current_size_ +
             (this->dependency_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->dependency_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      iVar3 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
      iVar7 = (this->dependency_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar7) {
        ppvVar4 = (this->dependency_).super_RepeatedPtrFieldBase.elements_;
        (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        psVar6 = (string *)ppvVar4[iVar3];
      }
      else {
        if (iVar7 == (this->dependency_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->dependency_).super_RepeatedPtrFieldBase,iVar7 + 1);
          iVar7 = (this->dependency_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->dependency_).super_RepeatedPtrFieldBase.allocated_size_ = iVar7 + 1;
        psVar6 = internal::StringTypeHandlerBase::New_abi_cxx11_();
        ppvVar4 = (this->dependency_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
        (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar4[iVar3] = psVar6;
      }
      std::__cxx11::string::_M_assign((string *)psVar6);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (from->dependency_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar3 = (from->public_dependency_).current_size_;
  if (iVar3 != 0) {
    RepeatedField<int>::Reserve
              (&this->public_dependency_,iVar3 + (this->public_dependency_).current_size_);
    memcpy((this->public_dependency_).elements_ + (this->public_dependency_).current_size_,
           (from->public_dependency_).elements_,(long)(from->public_dependency_).current_size_ << 2)
    ;
    piVar1 = &(this->public_dependency_).current_size_;
    *piVar1 = *piVar1 + (from->public_dependency_).current_size_;
  }
  iVar3 = (from->weak_dependency_).current_size_;
  if (iVar3 != 0) {
    RepeatedField<int>::Reserve
              (&this->weak_dependency_,iVar3 + (this->weak_dependency_).current_size_);
    memcpy((this->weak_dependency_).elements_ + (this->weak_dependency_).current_size_,
           (from->weak_dependency_).elements_,(long)(from->weak_dependency_).current_size_ << 2);
    piVar1 = &(this->weak_dependency_).current_size_;
    *piVar1 = *piVar1 + (from->weak_dependency_).current_size_;
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->message_type_).super_RepeatedPtrFieldBase,
             (from->message_type_).super_RepeatedPtrFieldBase.current_size_ +
             (this->message_type_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      from_00 = (DescriptorProto *)(from->message_type_).super_RepeatedPtrFieldBase.elements_[lVar8]
      ;
      iVar3 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar7 = (this->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar7) {
        ppvVar4 = (this->message_type_).super_RepeatedPtrFieldBase.elements_;
        (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_00 = (DescriptorProto *)ppvVar4[iVar3];
      }
      else {
        if (iVar7 == (this->message_type_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->message_type_).super_RepeatedPtrFieldBase,iVar7 + 1);
          iVar7 = (this->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->message_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar7 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
        ppvVar4 = (this->message_type_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
        (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar4[iVar3] = this_00;
      }
      DescriptorProto::MergeFrom(this_00,from_00);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (from->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             (from->enum_type_).super_RepeatedPtrFieldBase.current_size_ +
             (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      from_01 = (EnumDescriptorProto *)
                (from->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar8];
      iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar7 = (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar7) {
        ppvVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
        (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_01 = (EnumDescriptorProto *)ppvVar4[iVar3];
      }
      else {
        if (iVar7 == (this->enum_type_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar7 + 1);
          iVar7 = (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar7 + 1;
        this_01 = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::New();
        ppvVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar4[iVar3] = this_01;
      }
      EnumDescriptorProto::MergeFrom(this_01,from_01);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (from->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->service_).super_RepeatedPtrFieldBase,
             (from->service_).super_RepeatedPtrFieldBase.current_size_ +
             (this->service_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->service_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      from_02 = (ServiceDescriptorProto *)
                (from->service_).super_RepeatedPtrFieldBase.elements_[lVar8];
      iVar3 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
      iVar7 = (this->service_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar7) {
        ppvVar4 = (this->service_).super_RepeatedPtrFieldBase.elements_;
        (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_02 = (ServiceDescriptorProto *)ppvVar4[iVar3];
      }
      else {
        if (iVar7 == (this->service_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->service_).super_RepeatedPtrFieldBase,iVar7 + 1);
          iVar7 = (this->service_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->service_).super_RepeatedPtrFieldBase.allocated_size_ = iVar7 + 1;
        this_02 = internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>::New();
        ppvVar4 = (this->service_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
        (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar4[iVar3] = this_02;
      }
      ServiceDescriptorProto::MergeFrom(this_02,from_02);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (from->service_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->extension_).super_RepeatedPtrFieldBase,
             (from->extension_).super_RepeatedPtrFieldBase.current_size_ +
             (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      from_03 = (FieldDescriptorProto *)
                (from->extension_).super_RepeatedPtrFieldBase.elements_[lVar8];
      iVar3 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
      iVar7 = (this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar7) {
        ppvVar4 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
        (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_03 = (FieldDescriptorProto *)ppvVar4[iVar3];
      }
      else {
        if (iVar7 == (this->extension_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->extension_).super_RepeatedPtrFieldBase,iVar7 + 1);
          iVar7 = (this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->extension_).super_RepeatedPtrFieldBase.allocated_size_ = iVar7 + 1;
        this_03 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
        ppvVar4 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
        (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar4[iVar3] = this_03;
      }
      FieldDescriptorProto::MergeFrom(this_03,from_03);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (from->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  uVar5 = from->_has_bits_[0];
  if ((char)uVar5 != '\0') {
    if ((uVar5 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      psVar6 = this->name_;
      if (psVar6 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar6 = (string *)operator_new(0x20);
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar6;
      }
      std::__cxx11::string::_M_assign((string *)psVar6);
      uVar5 = from->_has_bits_[0];
    }
    if ((uVar5 & 2) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      psVar6 = this->package_;
      if (psVar6 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar6 = (string *)operator_new(0x20);
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        this->package_ = psVar6;
      }
      std::__cxx11::string::_M_assign((string *)psVar6);
      uVar5 = from->_has_bits_[0];
    }
  }
  if ((uVar5 & 0x1fe00) != 0) {
    if ((uVar5 >> 9 & 1) != 0) {
      pbVar2 = (byte *)((long)this->_has_bits_ + 1);
      *pbVar2 = *pbVar2 | 2;
      this_04 = this->options_;
      if (this_04 == (FileOptions *)0x0) {
        this_04 = (FileOptions *)operator_new(0x88);
        FileOptions::FileOptions(this_04);
        this->options_ = this_04;
      }
      from_04 = from->options_;
      if (from_04 == (FileOptions *)0x0) {
        from_04 = *(FileOptions **)(default_instance_ + 0xb8);
      }
      FileOptions::MergeFrom(this_04,from_04);
      uVar5 = from->_has_bits_[0];
    }
    if ((uVar5 >> 10 & 1) != 0) {
      pbVar2 = (byte *)((long)this->_has_bits_ + 1);
      *pbVar2 = *pbVar2 | 4;
      this_05 = this->source_code_info_;
      if (this_05 == (SourceCodeInfo *)0x0) {
        this_05 = (SourceCodeInfo *)operator_new(0x30);
        SourceCodeInfo::SourceCodeInfo(this_05);
        this->source_code_info_ = this_05;
      }
      from_05 = from->source_code_info_;
      if (from_05 == (SourceCodeInfo *)0x0) {
        from_05 = *(SourceCodeInfo **)(default_instance_ + 0xc0);
      }
      SourceCodeInfo::MergeFrom(this_05,from_05);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void FileDescriptorProto::MergeFrom(const FileDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  dependency_.MergeFrom(from.dependency_);
  public_dependency_.MergeFrom(from.public_dependency_);
  weak_dependency_.MergeFrom(from.weak_dependency_);
  message_type_.MergeFrom(from.message_type_);
  enum_type_.MergeFrom(from.enum_type_);
  service_.MergeFrom(from.service_);
  extension_.MergeFrom(from.extension_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_package()) {
      set_package(from.package());
    }
  }
  if (from._has_bits_[9 / 32] & (0xffu << (9 % 32))) {
    if (from.has_options()) {
      mutable_options()->::google::protobuf::FileOptions::MergeFrom(from.options());
    }
    if (from.has_source_code_info()) {
      mutable_source_code_info()->::google::protobuf::SourceCodeInfo::MergeFrom(from.source_code_info());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}